

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O3

size_t divide_subset_split(size_t *ix_arr,double *x,size_t st,size_t end,double split_point)

{
  size_t sVar1;
  size_t st_orig;
  ulong uVar2;
  
  uVar2 = st;
  if (st <= end) {
    do {
      if (*x <= split_point) {
        sVar1 = ix_arr[st];
        ix_arr[st] = ix_arr[uVar2];
        ix_arr[uVar2] = sVar1;
        st = st + 1;
      }
      uVar2 = uVar2 + 1;
      x = x + 1;
    } while (uVar2 <= end);
    return st;
  }
  return st;
}

Assistant:

size_t divide_subset_split(size_t ix_arr[], double x[], size_t st, size_t end, double split_point) noexcept
{
    size_t temp;
    size_t st_orig = st;
    for (size_t row = st_orig; row <= end; row++)
    {
        if (x[row - st_orig] <= split_point)
        {
            temp        = ix_arr[st];
            ix_arr[st]  = ix_arr[row];
            ix_arr[row] = temp;
            st++;
        }
    }
    return st;
}